

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void kratos::CheckFlipFlopAlwaysFFVisitor::check_always_ff(SequentialStmtBlock *stmt)

{
  pointer psVar1;
  pointer psVar2;
  StmtException *this;
  ulong uVar3;
  bool bVar4;
  initializer_list<kratos::IRNode_*> __l;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_78;
  SequentialStmtBlock *local_60;
  undefined1 local_58 [8];
  shared_ptr<kratos::Stmt> s;
  allocator<char> local_32;
  allocator_type local_31;
  
  psVar1 = (stmt->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (stmt->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar4 = false;
  for (uVar3 = 0; (!bVar4 && (uVar3 < (ulong)((long)psVar1 - (long)psVar2 >> 4))); uVar3 = uVar3 + 1
      ) {
    StmtBlock::get_stmt((StmtBlock *)local_58,(uint64_t)stmt);
    bVar4 = *(int *)((long)local_58 + 0x78) == 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s);
  }
  if ((bVar4) &&
     (0x10 < (ulong)((long)(stmt->super_StmtBlock).stmts_.
                           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(stmt->super_StmtBlock).stmts_.
                          super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                          ._M_impl.super__Vector_impl_data._M_start))) {
    this = (StmtException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_58,anon_var_dwarf_71b7dc,&local_32);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_60;
    local_60 = stmt;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_78,__l,&local_31);
    StmtException::StmtException(this,(string *)local_58,&local_78);
    __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void static check_always_ff(SequentialStmtBlock* stmt) {
        // first pass to determine if there is any if statement in top level
        bool has_if = false;
        uint64_t i = 0;
        uint64_t stmt_count = stmt->size();
        while ((!has_if) && (i < stmt_count)) {
            auto s = stmt->get_stmt(i);
            if (s->type() == StatementType::If) has_if = true;
            i++;
        }
        if (has_if && stmt->size() > 1) {
            // DC cannot infer as a D-flip-flop
            // error message copied from DC
            throw StmtException(
                "The statements in this 'always' block are outside the "
                "scope of the synthesis policy. Only an ’if’ statement "
                "is allowed at the top level in this ’always’ block. (ELAB-302)",
                {stmt});
        }
    }